

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_node_same_normal(REF_GRID ref_grid,REF_INT node,REF_BOOL *allowed)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  bool bVar1;
  uint uVar2;
  REF_INT local_124;
  REF_INT local_120;
  int local_11c;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL first_tri;
  REF_STATUS status;
  REF_DBL dot;
  REF_DBL first_normal [3];
  REF_DBL local_d8;
  REF_DBL normal [3];
  REF_INT local_b8 [2];
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  *allowed = 1;
  bVar1 = true;
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_11c = -1;
  }
  else {
    local_11c = ref_cell_00->ref_adj->first[node];
  }
  local_3c = local_11c;
  if (local_11c == -1) {
    local_120 = -1;
  }
  else {
    local_120 = ref_cell_00->ref_adj->item[local_11c].ref;
  }
  local_40 = local_120;
  while( true ) {
    if (local_3c == -1) {
      return 0;
    }
    uVar2 = ref_cell_nodes(ref_cell_00,local_40,local_b8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x3e2,"ref_smooth_node_same_normal",(ulong)uVar2,"nodes");
      return uVar2;
    }
    uVar2 = ref_node_tri_normal(ref_node_00,local_b8,&local_d8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x3e3,"ref_smooth_node_same_normal",(ulong)uVar2,"orig normal");
      return uVar2;
    }
    if (bVar1) {
      bVar1 = false;
      dot = local_d8;
      first_normal[0] = normal[0];
      first_normal[1] = normal[1];
      uVar2 = ref_math_normalize(&dot);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x3e9,"ref_smooth_node_same_normal",(ulong)uVar2,"original triangle has zero area");
        return uVar2;
      }
    }
    uVar2 = ref_math_normalize(&local_d8);
    if (uVar2 == 4) break;
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x3f0,"ref_smooth_node_same_normal",(ulong)uVar2,"new normal length");
      return uVar2;
    }
    if (first_normal[1] * normal[1] + dot * local_d8 + first_normal[0] * normal[0] <
        ref_node_00->same_normal_tol) {
      *allowed = 0;
      return 0;
    }
    local_3c = ref_cell_00->ref_adj->item[local_3c].next;
    if (local_3c == -1) {
      local_124 = -1;
    }
    else {
      local_124 = ref_cell_00->ref_adj->item[local_3c].ref;
    }
    local_40 = local_124;
  }
  *allowed = 0;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_node_same_normal(REF_GRID ref_grid,
                                                      REF_INT node,
                                                      REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normal[3], first_normal[3];
  REF_DBL dot;
  REF_STATUS status;
  REF_BOOL first_tri;

  *allowed = REF_TRUE;

  first_tri = REF_TRUE;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal), "orig normal");
    if (first_tri) {
      first_tri = REF_FALSE;
      first_normal[0] = normal[0];
      first_normal[1] = normal[1];
      first_normal[2] = normal[2];
      RSS(ref_math_normalize(first_normal), "original triangle has zero area");
    }
    status = ref_math_normalize(normal);
    if (REF_DIV_ZERO == status) { /* new triangle face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(status, "new normal length");
    dot = ref_math_dot(first_normal, normal);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}